

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initsout.c
# Opt level: O3

LispPTR * fixp_value(LispPTR *ptr)

{
  uint uVar1;
  LispPTR ptr_00;
  uint *puVar2;
  
  uVar1 = *ptr;
  if ((ulong)uVar1 < 0xfffff) {
    ptr_00 = N_OP_createcell(0xe0002);
    if ((ptr_00 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n");
    }
    puVar2 = (uint *)(Lisp_world + ptr_00);
    *puVar2 = uVar1 & 0xffff;
    *ptr = ptr_00;
    if ((-1 < *(short *)((ulong)(ptr_00 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2)) &&
       (*GcDisabled_word != 0x4c)) {
      if (*Reclaim_cnt_word == 0) {
        rec_htfind(ptr_00,0);
      }
      else {
        htfind(ptr_00,0);
      }
    }
  }
  else {
    if ((uVar1 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar1);
    }
    puVar2 = (uint *)(Lisp_world + uVar1);
  }
  return puVar2;
}

Assistant:

LispPTR *fixp_value(LispPTR *ptr) {
  LispPTR val = *ptr;

  if (val < (S_NEGATIVE | 0xFFFF)) {
    LispPTR newval = N_OP_createcell(S_POSITIVE | TYPE_FIXP);
    LispPTR *newcell;
    newcell = (LispPTR *)NativeAligned4FromLAddr(newval);
    *newcell = val & 0xFFFF; /* it was smallp, so fill in */
    *ptr = newval;
    GCLOOKUP(newval, ADDREF); /* so it has a refcount */
    return ((LispPTR *)newcell);
  }
  return ((LispPTR *)NativeAligned4FromLAddr(val));
}